

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O3

Publication * __thiscall
helics::ValueFederate::getPublication(ValueFederate *this,string_view name,int index1,int index2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueFederateManager *this_00;
  size_type *psVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Publication *pPVar5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 uVar11;
  uint uVar12;
  string_view key;
  string __str;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (this->vfManager)._M_t.
            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,name._M_str,name._M_str + name._M_len);
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_50,local_50._M_string_length,0,1,'_');
  local_f0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar7) {
    local_f0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_f0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  uVar10 = -index1;
  if (0 < index1) {
    uVar10 = index1;
  }
  uVar12 = 1;
  if (9 < uVar10) {
    uVar9 = (ulong)uVar10;
    uVar3 = 4;
    do {
      uVar12 = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00253393;
      }
      if (uVar6 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00253393;
      }
      if (uVar6 < 10000) goto LAB_00253393;
      uVar9 = uVar9 / 10000;
      uVar3 = uVar12 + 4;
    } while (99999 < uVar6);
    uVar12 = uVar12 + 1;
  }
LAB_00253393:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_110,(ulong)(uVar12 + -(index1 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_110._M_dataplus._M_p + (uint)-(index1 >> 0x1f),uVar12,uVar10);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    uVar11 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_110._M_string_length + local_f0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar11 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_110._M_string_length + local_f0._M_string_length) goto LAB_0025340a;
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_110,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  else {
LAB_0025340a:
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_f0,local_110._M_dataplus._M_p,local_110._M_string_length);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar8 == paVar7) {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar8;
  }
  local_b0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_b0,local_b0._M_string_length,0,1,'_');
  paVar7 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar8 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar8) {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  uVar10 = -index2;
  if (0 < index2) {
    uVar10 = index2;
  }
  uVar12 = 1;
  if (9 < uVar10) {
    uVar9 = (ulong)uVar10;
    uVar3 = 4;
    do {
      uVar12 = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00253537;
      }
      if (uVar6 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00253537;
      }
      if (uVar6 < 10000) goto LAB_00253537;
      uVar9 = uVar9 / 10000;
      uVar3 = uVar12 + 4;
    } while (99999 < uVar6);
    uVar12 = uVar12 + 1;
  }
LAB_00253537:
  paVar8 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar8;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar12 + -(index2 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-(index2 >> 0x1f),uVar12,uVar10);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar7) {
    uVar11 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_70._M_string_length + local_90._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar8) {
      uVar11 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_90._M_string_length <= (ulong)uVar11) {
      pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_70,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
      goto LAB_002535e4;
    }
  }
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_90,local_70._M_dataplus._M_p,local_70._M_string_length);
LAB_002535e4:
  local_d0 = &local_c0;
  psVar2 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar1) {
    local_c0 = paVar1->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_c0 = paVar1->_M_allocated_capacity;
    local_d0 = psVar2;
  }
  local_c8 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  key._M_str = (char *)local_d0;
  key._M_len = local_c8;
  pPVar5 = ValueFederateManager::getPublication(this_00,key);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar8) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar7) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return pPVar5;
}

Assistant:

const Publication&
    ValueFederate::getPublication(std::string_view name, int index1, int index2) const
{
    return vfManager->getPublication(std::string(name) + '_' + std::to_string(index1) + '_' +
                                     std::to_string(index2));
}